

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
Hpipe::Vec<std::__cxx11::string>::push_back_unique<char_const(&)[244]>
          (Vec<std::__cxx11::string> *this,char (*val) [244])

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  uint uVar3;
  long lVar4;
  
  uVar3 = 0;
  do {
    if ((ulong)(*(long *)(this + 8) - *(long *)this >> 5) <= (ulong)uVar3) {
      pbVar2 = push_back<char_const(&)[244]>(this,val);
      return pbVar2;
    }
    lVar4 = (ulong)uVar3 * 0x20;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*(long *)this + lVar4),*val);
    uVar3 = uVar3 + 1;
  } while (!bVar1);
  return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (lVar4 + *(long *)this);
}

Assistant:

T       *push_back_unique     ( Arg &&val ) { for( unsigned i = 0; i < this->size(); ++i ) if ( this->operator[]( i ) == val ) return &this->operator[]( i ); return push_back( std::forward<Arg>( val ) ); }